

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_ubjson_size_type
          (binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
           *this,pair<unsigned_long,_int> *result,bool inside_ndarray)

{
  long *plVar1;
  undefined8 uVar2;
  bool bVar3;
  char_int_type cVar4;
  byte in_DL;
  undefined8 *in_RSI;
  long in_RDI;
  bool is_error_1;
  bool is_error;
  string last_token_1;
  string last_token;
  bool is_ndarray;
  char_int_type in_stack_00000574;
  bool *in_stack_00000578;
  size_t *in_stack_00000580;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_00000588;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  char (*in_stack_fffffffffffffc48) [51];
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  char (*in_stack_fffffffffffffc58) [10];
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffc68;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *this_01;
  string *in_stack_fffffffffffffc70;
  string *context;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  undefined4 uVar5;
  undefined8 in_stack_fffffffffffffc80;
  input_format_t iVar6;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  allocator<char> local_2f9;
  string local_2f8 [39];
  allocator<char> local_2d1;
  void *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  input_format_t in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  string local_2b0 [32];
  undefined1 local_290 [40];
  string local_268 [38];
  undefined1 local_242;
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [32];
  string local_1f8 [32];
  undefined1 local_1d8 [40];
  string local_1b0 [38];
  undefined1 local_18a;
  allocator<char> local_189;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  undefined1 local_128 [40];
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [48];
  string local_a8 [32];
  string local_88 [32];
  undefined1 local_68 [40];
  string local_40 [38];
  byte local_1a;
  byte local_19;
  undefined8 *local_18;
  byte local_1;
  
  iVar6 = (input_format_t)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  local_19 = in_DL & 1;
  *in_RSI = 0xffffffffffffffff;
  *(undefined4 *)(in_RSI + 1) = 0;
  local_1a = 0;
  local_18 = in_RSI;
  get_ignore_noop(in_stack_fffffffffffffc20);
  if (*(int *)(in_RDI + 0x10) == 0x24) {
    cVar4 = get(in_stack_fffffffffffffc20);
    *(char_int_type *)(local_18 + 1) = cVar4;
    if (*(int *)(in_RDI + 0x24) == 5) {
      std::array<int,_8UL>::begin((array<int,_8UL> *)0x27c5fc);
      std::array<int,_8UL>::end((array<int,_8UL> *)0x27c615);
      bVar3 = std::binary_search<int_const*,int>
                        ((int *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                         (int *)in_stack_fffffffffffffc48,
                         (int *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
      if (bVar3) {
        get_token_string(in_stack_fffffffffffffc68);
        plVar1 = *(long **)(in_RDI + 0x28);
        uVar2 = *(undefined8 *)(in_RDI + 0x18);
        concat<std::__cxx11::string,char_const(&)[10],std::__cxx11::string&,char_const(&)[41]>
                  (in_stack_fffffffffffffc58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                   (char (*) [41])in_stack_fffffffffffffc48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc60,*in_stack_fffffffffffffc58,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50))
        ;
        exception_message((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                           *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),iVar6,
                          (string *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                          in_stack_fffffffffffffc70);
        parse_error::create<std::nullptr_t,_0>
                  (in_stack_fffffffffffffd4c,
                   CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
        local_1 = (**(code **)(*plVar1 + 0x60))(plVar1,uVar2,local_40,local_68);
        local_1 = local_1 & 1;
        parse_error::~parse_error((parse_error *)0x27c78b);
        std::__cxx11::string::~string(local_88);
        std::__cxx11::string::~string(local_d8);
        std::allocator<char>::~allocator(&local_d9);
        std::__cxx11::string::~string(local_a8);
        std::__cxx11::string::~string(local_40);
        goto LAB_0027d0f2;
      }
    }
    bVar3 = unexpect_eof((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                          *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                         in_stack_fffffffffffffd44,(char *)in_stack_fffffffffffffd38);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      get_ignore_noop(in_stack_fffffffffffffc20);
      if (*(int *)(in_RDI + 0x10) == 0x23) {
        local_18a = get_ubjson_size_value
                              (in_stack_00000588,in_stack_00000580,in_stack_00000578,
                               in_stack_00000574);
        local_1 = local_18a;
        if ((*(int *)(in_RDI + 0x24) == 5) && ((local_1a & 1) != 0)) {
          if ((local_19 & 1) == 0) {
            *(uint *)(local_18 + 1) = *(uint *)(local_18 + 1) | 0x100;
          }
          else {
            this_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       (in_RDI + 0x18);
            this_01 = *(binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        **)(in_RDI + 0x28);
            get_token_string(this_01);
            context = *(string **)(in_RDI + 0x18);
            uVar5 = *(undefined4 *)(in_RDI + 0x24);
            iVar6 = (input_format_t)((ulong)&local_219 >> 0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_00,*in_stack_fffffffffffffc58,
                       (allocator<char> *)
                       CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
            __s = &local_241;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_00,(char *)__s,
                       (allocator<char> *)
                       CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
            exception_message((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                               *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),iVar6
                              ,(string *)CONCAT44(uVar5,in_stack_fffffffffffffc78),context);
            parse_error::create<std::nullptr_t,_0>
                      (in_stack_fffffffffffffd4c,
                       CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                       in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
            local_1 = (**(code **)((this_01->ia).current._M_current + 0x60))
                                (this_01,this_00,local_1b0,local_1d8);
            local_1 = local_1 & 1;
            parse_error::~parse_error((parse_error *)0x27cce4);
            std::__cxx11::string::~string(local_1f8);
            std::__cxx11::string::~string(local_240);
            std::allocator<char>::~allocator(&local_241);
            std::__cxx11::string::~string(local_218);
            std::allocator<char>::~allocator(&local_219);
            std::__cxx11::string::~string(local_1b0);
          }
        }
      }
      else {
        bVar3 = unexpect_eof((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                              *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                             in_stack_fffffffffffffd44,(char *)in_stack_fffffffffffffd38);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          get_token_string(in_stack_fffffffffffffc68);
          plVar1 = *(long **)(in_RDI + 0x28);
          uVar2 = *(undefined8 *)(in_RDI + 0x18);
          concat<std::__cxx11::string,char_const(&)[51],std::__cxx11::string&>
                    (in_stack_fffffffffffffc48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc60,*in_stack_fffffffffffffc58,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          exception_message((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                             *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),iVar6,
                            (string *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                            in_stack_fffffffffffffc70);
          parse_error::create<std::nullptr_t,_0>
                    (in_stack_fffffffffffffd4c,
                     CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
          local_1 = (**(code **)(*plVar1 + 0x60))(plVar1,uVar2,local_100,local_128);
          local_1 = local_1 & 1;
          parse_error::~parse_error((parse_error *)0x27ca56);
          std::__cxx11::string::~string(local_148);
          std::__cxx11::string::~string(local_188);
          std::allocator<char>::~allocator(&local_189);
          std::__cxx11::string::~string(local_168);
          std::__cxx11::string::~string(local_100);
        }
        else {
          local_1 = 0;
        }
      }
    }
    else {
      local_1 = 0;
    }
  }
  else if (*(int *)(in_RDI + 0x10) == 0x23) {
    local_242 = get_ubjson_size_value
                          (in_stack_00000588,in_stack_00000580,in_stack_00000578,in_stack_00000574);
    local_1 = local_242;
    if ((*(int *)(in_RDI + 0x24) == 5) && ((local_1a & 1) != 0)) {
      uVar2 = *(undefined8 *)(in_RDI + 0x18);
      plVar1 = *(long **)(in_RDI + 0x28);
      get_token_string(in_stack_fffffffffffffc68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc60,*in_stack_fffffffffffffc58,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc60,*in_stack_fffffffffffffc58,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
      exception_message((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                         *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),iVar6,
                        (string *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                        in_stack_fffffffffffffc70);
      parse_error::create<std::nullptr_t,_0>
                (in_stack_fffffffffffffd4c,
                 CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                 in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      local_1 = (**(code **)(*plVar1 + 0x60))(plVar1,uVar2,local_268,local_290);
      local_1 = local_1 & 1;
      parse_error::~parse_error((parse_error *)0x27cfb9);
      std::__cxx11::string::~string(local_2b0);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd30);
      std::allocator<char>::~allocator(&local_2d1);
      std::__cxx11::string::~string(local_268);
    }
  }
  else {
    local_1 = 1;
  }
LAB_0027d0f2:
  return (bool)(local_1 & 1);
}

Assistant:

bool get_ubjson_size_type(std::pair<std::size_t, char_int_type>& result, bool inside_ndarray = false)
    {
        result.first = npos; // size
        result.second = 0; // type
        bool is_ndarray = false;

        get_ignore_noop();

        if (current == '$')
        {
            result.second = get();  // must not ignore 'N', because 'N' maybe the type
            if (input_format == input_format_t::bjdata
                    && JSON_HEDLEY_UNLIKELY(std::binary_search(bjd_optimized_type_markers.begin(), bjd_optimized_type_markers.end(), result.second)))
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read,
                                        exception_message(input_format, concat("marker 0x", last_token, " is not a permitted optimized array type"), "type"), nullptr));
            }

            if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format, "type")))
            {
                return false;
            }

            get_ignore_noop();
            if (JSON_HEDLEY_UNLIKELY(current != '#'))
            {
                if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format, "value")))
                {
                    return false;
                }
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read,
                                        exception_message(input_format, concat("expected '#' after type information; last byte: 0x", last_token), "size"), nullptr));
            }

            const bool is_error = get_ubjson_size_value(result.first, is_ndarray);
            if (input_format == input_format_t::bjdata && is_ndarray)
            {
                if (inside_ndarray)
                {
                    return sax->parse_error(chars_read, get_token_string(), parse_error::create(112, chars_read,
                                            exception_message(input_format, "ndarray can not be recursive", "size"), nullptr));
                }
                result.second |= (1 << 8); // use bit 8 to indicate ndarray, all UBJSON and BJData markers should be ASCII letters
            }
            return is_error;
        }

        if (current == '#')
        {
            const bool is_error = get_ubjson_size_value(result.first, is_ndarray);
            if (input_format == input_format_t::bjdata && is_ndarray)
            {
                return sax->parse_error(chars_read, get_token_string(), parse_error::create(112, chars_read,
                                        exception_message(input_format, "ndarray requires both type and size", "size"), nullptr));
            }
            return is_error;
        }

        return true;
    }